

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::InitializeElementMatrix
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *this,TPZElementMatrix *ek,
          TPZElementMatrix *ef)

{
  long lVar1;
  uint num_of_blocks;
  int iVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  TPZConnect *pTVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  _List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> local_48;
  
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ek->fMesh = pTVar4;
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ef->fMesh = pTVar4;
  ek->fType = EK;
  ef->fType = EF;
  num_of_blocks =
       (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this);
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)num_of_blocks) {
    uVar7 = num_of_blocks;
  }
  iVar8 = 0;
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pTVar5 = (TPZConnect *)
             (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                       (this,uVar9);
    pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
    iVar2 = TPZConnect::NDof(pTVar5,pTVar4);
    iVar8 = iVar8 + iVar2;
  }
  lVar12 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  iVar2 = InitializeElementMatrix::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&local_48);
  lVar10 = 0;
  if (lVar12 < 1) {
    lVar12 = lVar10;
  }
  while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
    lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar10)
    ;
    if (lVar1 != 0) {
      plVar6 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0)
      ;
      if (plVar6 != (long *)0x0) {
        plVar6 = (long *)(**(code **)(*plVar6 + 0xb8))(plVar6);
        (**(code **)(*plVar6 + 0x78))(plVar6);
      }
    }
    lVar10 = lVar10 + 0x10;
  }
  iVar3 = (*ek->_vptr_TPZElementMatrix[8])(ek);
  lVar12 = (long)iVar8;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x70))
            ((long *)CONCAT44(extraout_var,iVar3),lVar12,lVar12);
  iVar8 = (*ef->_vptr_TPZElementMatrix[8])(ef);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x70))
            ((long *)CONCAT44(extraout_var_00,iVar8),lVar12,(long)iVar2);
  iVar8 = (*ek->_vptr_TPZElementMatrix[10])(ek);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_01,iVar8),num_of_blocks);
  iVar8 = (*ef->_vptr_TPZElementMatrix[10])(ef);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_02,iVar8),num_of_blocks);
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pTVar5 = (TPZConnect *)
             (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                       (this,uVar9);
    pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
    iVar8 = TPZConnect::NDof(pTVar5,pTVar4);
    iVar2 = (*ek->_vptr_TPZElementMatrix[10])(ek);
    TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_03,iVar2),uVar9,iVar8,-1);
    iVar2 = (*ef->_vptr_TPZElementMatrix[10])(ef);
    TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_04,iVar2),uVar9,iVar8,-1);
  }
  TPZManVector<long,_10>::Resize
            (&(ek->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
  TPZManVector<long,_10>::Resize
            (&(ef->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
  for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
    lVar12 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                       (this,uVar11 & 0xffffffff);
    (ek->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar11] = lVar12;
    lVar12 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                       (this,uVar11 & 0xffffffff);
    (ef->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar11] = lVar12;
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_48,this);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_move_assign
            (&ek->fOneRestraints,&local_48);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_48);
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_48,this);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_move_assign
            (&ef->fOneRestraints,&local_48);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_48);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ek, TPZElementMatrix &ef)
{
    ek.fMesh = Mesh();
    ef.fMesh = Mesh();
    ek.fType = TPZElementMatrix::EK;
    ef.fType = TPZElementMatrix::EF;
    const int ncon = this->NConnects();
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ek.Matrix().Redim(numeq,numeq);
    ef.Matrix().Redim(numeq,numloadcases);
    ek.Block().SetNBlocks(ncon);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ek.Block().Set(i,ndof);
        ef.Block().Set(i,ndof);
    }
    ek.fConnect.Resize(ncon);
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ek.fConnect)[i] = ConnectIndex(i);
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ek.fOneRestraints = GetShapeRestraints();
    ef.fOneRestraints = GetShapeRestraints();
}